

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.cpp
# Opt level: O0

void __thiscall World::Login(World *this,Character *character)

{
  TileSpec TVar1;
  Map *pMVar2;
  char local_33;
  char local_31;
  TileSpec spec;
  Map *map;
  Character *character_local;
  World *this_local;
  
  map = (Map *)character;
  character_local = (Character *)this;
  std::vector<Character_*,_std::allocator<Character_*>_>::push_back
            (&this->characters,(value_type *)&map);
  pMVar2 = GetMap(this,*(short *)((long)&(map->jukebox_player).field_2 + 6));
  if ((pMVar2->relog_x != '\0') ||
     (pMVar2 = GetMap(this,*(short *)((long)&(map->jukebox_player).field_2 + 6)),
     pMVar2->relog_y != '\0')) {
    pMVar2 = GetMap(this,*(short *)((long)&(map->jukebox_player).field_2 + 6));
    (map->jukebox_player).field_2._M_local_buf[8] = pMVar2->relog_x;
    pMVar2 = GetMap(this,*(short *)((long)&(map->jukebox_player).field_2 + 6));
    (map->jukebox_player).field_2._M_local_buf[9] = pMVar2->relog_y;
  }
  pMVar2 = GetMap(this,*(short *)((long)&(map->jukebox_player).field_2 + 6));
  if (*(char *)((long)&map[1].npcs.super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
                       super__Vector_impl_data._M_start + 4) == '\x01') {
    TVar1 = Map::GetSpec(pMVar2,(map->jukebox_player).field_2._M_local_buf[8],
                         (map->jukebox_player).field_2._M_local_buf[9]);
    if (TVar1 == ChairDown) {
      (map->jukebox_player).field_2._M_local_buf[10] = '\0';
    }
    else if (TVar1 == ChairUp) {
      (map->jukebox_player).field_2._M_local_buf[10] = '\x02';
    }
    else if (TVar1 == ChairLeft) {
      (map->jukebox_player).field_2._M_local_buf[10] = '\x01';
    }
    else if (TVar1 == ChairRight) {
      (map->jukebox_player).field_2._M_local_buf[10] = '\x03';
    }
    else if (TVar1 == ChairDownRight) {
      local_31 = '\x03';
      if ((map->jukebox_player).field_2._M_local_buf[10] != '\x03') {
        local_31 = '\0';
      }
      (map->jukebox_player).field_2._M_local_buf[10] = local_31;
    }
    else if (TVar1 == ChairUpLeft) {
      local_33 = '\x01';
      if ((map->jukebox_player).field_2._M_local_buf[10] != '\x01') {
        local_33 = '\x02';
      }
      (map->jukebox_player).field_2._M_local_buf[10] = local_33;
    }
    else if (TVar1 != ChairAll) {
      *(undefined1 *)
       ((long)&map[1].npcs.super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
               super__Vector_impl_data._M_start + 4) = 0;
    }
  }
  Map::Enter(pMVar2,(Character *)map,WARP_ANIMATION_NONE);
  Character::Login((Character *)map);
  return;
}

Assistant:

void World::Login(Character *character)
{
	this->characters.push_back(character);

	if (this->GetMap(character->mapid)->relog_x || this->GetMap(character->mapid)->relog_y)
	{
		character->x = this->GetMap(character->mapid)->relog_x;
		character->y = this->GetMap(character->mapid)->relog_y;
	}

	Map* map = this->GetMap(character->mapid);

	if (character->sitting == SIT_CHAIR)
	{
		Map_Tile::TileSpec spec = map->GetSpec(character->x, character->y);

		if (spec == Map_Tile::ChairDown)
			character->direction = DIRECTION_DOWN;
		else if (spec == Map_Tile::ChairUp)
			character->direction = DIRECTION_UP;
		else if (spec == Map_Tile::ChairLeft)
			character->direction = DIRECTION_LEFT;
		else if (spec == Map_Tile::ChairRight)
			character->direction = DIRECTION_RIGHT;
		else if (spec == Map_Tile::ChairDownRight)
			character->direction = character->direction == DIRECTION_RIGHT ? DIRECTION_RIGHT : DIRECTION_DOWN;
		else if (spec == Map_Tile::ChairUpLeft)
			character->direction = character->direction == DIRECTION_LEFT ? DIRECTION_LEFT : DIRECTION_UP;
		else if (spec != Map_Tile::ChairAll)
			character->sitting = SIT_STAND;
	}

	map->Enter(character);
	character->Login();
}